

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall
InterpGCTest_Collect_TableCycle_Test::InterpGCTest_Collect_TableCycle_Test
          (InterpGCTest_Collect_TableCycle_Test *this)

{
  InterpGCTest_Collect_TableCycle_Test *this_local;
  
  InterpGCTest::InterpGCTest(&this->super_InterpGCTest);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpGCTest_Collect_TableCycle_Test_005adee8;
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_TableCycle) {
  auto tt = TableType{ValueType::Anyref, Limits{2}};
  auto t1 = Table::New(store_, tt);
  auto t2 = Table::New(store_, tt);
  auto t3 = Table::New(store_, tt);

  t1->Set(store_, 0, t1->self());  // t1 references itself.
  t2->Set(store_, 0, t3->self());
  t3->Set(store_, 0, t2->self());  // t2 and t3 reference each other.
  t3->Set(store_, 1, t1->self());  // t3 also references t1.

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 3, after_new);

  // Remove t1 and t2 roots, but their kept alive by t3.
  t1.reset();
  t2.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove t3 root, now all should be removed.
  t3.reset();
}